

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

WirehairResult __thiscall wirehair::Codec::ResumeSolveMatrix(Codec *this,uint id,void *data)

{
  PeelRow *pPVar1;
  ulong *puVar2;
  uint8_t uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  PeelColumn *pPVar10;
  uint64_t *puVar11;
  uint16_t *puVar12;
  uint64_t *puVar13;
  uint8_t *puVar14;
  byte y;
  bool bVar15;
  uint uVar16;
  ulong uVar17;
  uint ge_column_j;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ushort uVar22;
  uint uVar23;
  uint uVar24;
  uint16_t uVar25;
  ushort *puVar26;
  uint uVar27;
  uint i;
  long lVar29;
  uint8_t *puVar30;
  ulong uVar31;
  RowMixIterator mix;
  ulong local_50;
  short asStack_36 [3];
  ulong uVar28;
  
  if (data == (void *)0x0) {
    return Wirehair_InvalidInput;
  }
  uVar22 = this->_row_count;
  uVar4 = this->_block_count;
  uVar19 = (uint)uVar22;
  if ((uint)uVar22 < (uint)this->_extra_count + (uint)uVar4) {
    local_50 = (ulong)this->_pivot_count;
    this->_pivot_count = this->_pivot_count + 1;
    this->_row_count = uVar22 + 1;
    uVar27 = (uVar19 - uVar4) + (uint)this->_dense_count + (uint)this->_defer_count;
    uVar28 = (ulong)uVar27;
    this->_ge_row_map[uVar28] = uVar22;
    this->_pivots[local_50] = (uint16_t)uVar27;
    uVar4 = this->_block_count;
  }
  else {
    local_50 = (ulong)this->_next_pivot;
    if (this->_pivot_count <= this->_next_pivot) {
      return Wirehair_ExtraInsufficient;
    }
    uVar22 = this->_dense_count + this->_defer_count;
    puVar26 = this->_pivots + local_50;
    do {
      if ((uVar22 <= *puVar26) && ((uint)*puVar26 < (uint)uVar22 + (uint)this->_extra_count)) {
        local_50 = local_50 & 0xffff;
        goto LAB_00106923;
      }
      uVar19 = (int)local_50 + 1;
      local_50 = (ulong)uVar19;
      puVar26 = puVar26 + 1;
    } while (this->_pivot_count != uVar19);
    local_50 = 0;
LAB_00106923:
    if ((int)local_50 == 0) {
      return Wirehair_ExtraInsufficient;
    }
    uVar28 = (ulong)this->_pivots[local_50];
    uVar19 = (uint)this->_ge_row_map[uVar28];
  }
  pPVar1 = this->_peel_rows + uVar19;
  pPVar1->RecoveryId = id;
  puVar30 = this->_input_blocks + uVar19 * this->_block_bytes;
  if (uVar4 - 1 == id) {
    memcpy(puVar30,data,(ulong)this->_output_final_bytes);
    memset(puVar30 + this->_output_final_bytes,0,
           (ulong)(this->_block_bytes - this->_output_final_bytes));
  }
  else {
    memcpy(puVar30,data,(ulong)this->_block_bytes);
  }
  puVar13 = this->_ge_matrix + this->_ge_pitch * (int)uVar28;
  memset(puVar13,0,(ulong)this->_ge_pitch << 3);
  PeelRowParameters::Initialize
            (&pPVar1->Params,id,this->_p_seed,this->_block_count,this->_mix_count);
  uVar22 = (pPVar1->Params).MixFirst;
  uVar25 = (pPVar1->Params).PeelCount;
  uVar17 = (ulong)(pPVar1->Params).PeelFirst;
  uVar4 = (pPVar1->Params).PeelAdd;
  uVar27 = (uint)uVar4;
  uVar5 = (pPVar1->Params).MixAdd;
  uVar16 = (uint)uVar5;
  uVar6 = this->_block_count;
  uVar7 = this->_block_next_prime;
  uVar8 = this->_mix_count;
  uVar9 = this->_mix_next_prime;
  lVar29 = 1;
  uVar19 = (uint)uVar22;
  do {
    uVar19 = ((uVar19 & 0xffff) + (uint)uVar5) % (uint)uVar9;
    if (uVar8 <= uVar19) {
      uVar19 = uVar9 - uVar19;
      uVar24 = uVar19 & 0xffff;
      if (uVar5 < (ushort)uVar19) {
        uVar19 = (uVar16 * 0x10000 - uVar24) % uVar16;
      }
      else {
        uVar19 = uVar16 - uVar24;
      }
    }
    asStack_36[lVar29] = (short)uVar19;
    lVar29 = lVar29 + 1;
  } while (lVar29 != 3);
  uVar5 = this->_defer_count;
  uVar20 = (ulong)((uint)uVar22 + (uint)uVar5);
  puVar13[(uVar20 & 0xffff) >> 6] = puVar13[(uVar20 & 0xffff) >> 6] ^ 1L << (uVar20 & 0x3f);
  puVar13[(ushort)(asStack_36[1] + uVar5) >> 6] =
       puVar13[(ushort)(asStack_36[1] + uVar5) >> 6] ^
       1L << ((ulong)(ushort)(asStack_36[1] + uVar5) & 0x3f);
  puVar13[(ushort)(asStack_36[2] + uVar5) >> 6] =
       puVar13[(ushort)(asStack_36[2] + uVar5) >> 6] ^
       1L << ((ulong)(ushort)(asStack_36[2] + uVar5) & 0x3f);
  pPVar10 = this->_peel_cols;
  puVar11 = this->_compress_matrix;
  uVar19 = this->_ge_pitch;
  while( true ) {
    uVar17 = uVar17 & 0xffff;
    uVar22 = pPVar10[uVar17].field_1.Weight2Refs;
    if (pPVar10[uVar17].Mark == '\x01') {
      if ((ulong)uVar19 != 0) {
        uVar20 = 0;
        do {
          puVar13[uVar20] = puVar13[uVar20] ^ puVar11[uVar22 * uVar19 + uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar19 != uVar20);
      }
    }
    else {
      puVar13[uVar22 >> 6] = puVar13[uVar22 >> 6] ^ 1L << ((ulong)uVar22 & 0x3f);
    }
    uVar25 = uVar25 - 1;
    if (uVar25 == 0) break;
    uVar17 = (ulong)((int)uVar17 + uVar27) % (ulong)uVar7;
    if ((uint)uVar6 <= (uint)uVar17) {
      uVar16 = (uint)uVar7 - (uint)uVar17;
      uVar24 = uVar16 & 0xffff;
      if (uVar4 < (ushort)uVar16) {
        uVar17 = (ulong)(uVar27 * 0x10000 - uVar24) % (ulong)uVar27;
      }
      else {
        uVar17 = (ulong)(uVar27 - uVar24);
      }
    }
  }
  uVar19 = this->_next_pivot;
  uVar17 = (ulong)uVar19;
  uVar20 = (ulong)this->_first_heavy_column;
  if (this->_first_heavy_column != 0 && uVar17 != 0) {
    puVar12 = this->_pivots;
    puVar11 = this->_ge_matrix;
    uVar27 = this->_ge_pitch;
    uVar21 = 1;
    uVar24 = 0;
    uVar16 = 0;
    do {
      uVar24 = uVar24 >> 6;
      if ((puVar13[uVar24] & uVar21) != 0) {
        uVar20 = (ulong)(puVar12[uVar16 & 0xffff] * uVar27);
        uVar23 = uVar27 - uVar24;
        *(uint64_t *)((long)puVar13 + (ulong)(uVar24 * 8)) =
             puVar13[uVar24] ^ uVar21 ^
             -uVar21 & *(ulong *)((long)puVar11 + uVar20 * 8 + (ulong)(uVar24 * 8));
        if (1 < uVar23) {
          uVar18 = (ulong)(((uVar16 & 0xffff) >> 6) << 3);
          uVar31 = 1;
          do {
            puVar2 = (ulong *)((long)puVar13 + uVar31 * 8 + uVar18);
            *puVar2 = *puVar2 ^ *(ulong *)((long)puVar11 + uVar31 * 8 + uVar18 + uVar20 * 8);
            uVar31 = uVar31 + 1;
          } while (uVar31 < uVar23);
        }
      }
      uVar20 = (ulong)this->_first_heavy_column;
      uVar16 = uVar16 + 1;
      uVar24 = uVar16 & 0xffff;
    } while ((uVar24 < uVar19) &&
            (uVar21 = uVar21 >> 0x3f | uVar21 << 1, uVar24 < this->_first_heavy_column));
  }
  uVar27 = (uint)uVar20;
  if (uVar19 < uVar27) {
    if ((puVar13[uVar19 >> 6] >> (uVar17 & 0x3f) & 1) == 0) {
      return Wirehair_NeedMore;
    }
    puVar12 = this->_pivots;
    puVar12[local_50] = puVar12[uVar17];
    puVar12[uVar17] = (uint16_t)uVar28;
  }
  else {
    uVar22 = this->_dense_count + uVar5;
    uVar19 = (uint)uVar8 + (uint)uVar5 & 0xffff;
    uVar16 = ((int)uVar28 - (uint)uVar22) * this->_heavy_pitch;
    puVar30 = this->_heavy_matrix;
    if (uVar27 < uVar19) {
      do {
        puVar30[(ulong)((int)uVar20 - this->_first_heavy_column) + (ulong)uVar16] =
             (puVar13[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0;
        uVar27 = (int)uVar20 + 1;
        uVar20 = (ulong)uVar27;
      } while (uVar19 != uVar27);
      uVar17 = (ulong)this->_next_pivot;
      uVar20 = (ulong)this->_first_heavy_column;
    }
    uVar27 = (uint)uVar20;
    if (uVar27 < (uint)uVar17) {
      do {
        uVar27 = (int)uVar20 - this->_first_heavy_column;
        y = puVar30[(ulong)uVar27 + (ulong)uVar16];
        if (y != 0) {
          uVar4 = this->_pivots[uVar20];
          if (uVar4 < uVar22) {
            uVar17 = uVar20 + 1;
            if (uVar17 < uVar19) {
              uVar27 = this->_ge_pitch;
              uVar21 = 1L << (uVar17 & 0x3f);
              puVar13 = this->_ge_matrix;
              do {
                if ((puVar13[(ulong)(uVar4 * uVar27) + (uVar17 >> 6 & 0x3ffffff)] & uVar21) != 0) {
                  puVar30[(ulong)((int)uVar17 - this->_first_heavy_column) + (ulong)uVar16] =
                       puVar30[(ulong)((int)uVar17 - this->_first_heavy_column) + (ulong)uVar16] ^ y
                  ;
                }
                uVar21 = uVar21 >> 0x3f | uVar21 << 1;
                uVar24 = (int)uVar17 + 1;
                uVar17 = (ulong)uVar24;
              } while (uVar24 < uVar19);
            }
          }
          else {
            uVar24 = ((uint)uVar4 - (uint)uVar22) * this->_heavy_pitch;
            puVar14 = this->_heavy_matrix;
            uVar3 = puVar14[(ulong)uVar27 + (ulong)uVar24];
            if (uVar3 != '\x01') {
              y = GF256Ctx.GF256_DIV_TABLE[CONCAT11(uVar3,y)];
              puVar30[(ulong)uVar27 + (ulong)uVar16] = y;
            }
            uVar27 = uVar27 + 1;
            gf256_muladd_mem(puVar30 + (ulong)uVar27 + (ulong)uVar16,y,
                             puVar14 + (ulong)uVar27 + (ulong)uVar24,this->_heavy_columns - uVar27);
          }
        }
        uVar17 = (ulong)this->_next_pivot;
        uVar20 = uVar20 + 1;
      } while (uVar20 < uVar17);
      uVar27 = this->_first_heavy_column;
    }
    uVar19 = (uint)uVar17;
    if (puVar30[(ulong)(uVar19 - uVar27) + (ulong)uVar16] == '\0') {
      return Wirehair_NeedMore;
    }
    uVar16 = this->_first_heavy_pivot;
    puVar12 = this->_pivots;
    if (uVar19 < uVar16) {
      puVar12[local_50] = puVar12[uVar16];
      puVar12[uVar16] = puVar12[uVar17];
      this->_first_heavy_pivot = uVar16 + 1;
    }
    else {
      puVar12[local_50] = puVar12[uVar17];
    }
    puVar12[uVar17] = (uint16_t)uVar28;
  }
  this->_next_pivot = uVar19 + 1;
  if (uVar19 + 1 == uVar27) {
    InsertHeavyRows(this);
  }
  bVar15 = Triangle(this);
  return (uint)!bVar15;
}

Assistant:

WirehairResult Codec::ResumeSolveMatrix(
    const unsigned id, ///< Block ID
    const void * GF256_RESTRICT data ///< Block data
)
{
    CAT_IF_DUMP(cout << endl << "---- ResumeSolveMatrix ----" << endl << endl;)

    if (!data) {
        return Wirehair_InvalidInput;
    }

    unsigned row_i, ge_row_i, new_pivot_i;

    // If there is no room for it:
    if (_row_count >= _block_count + _extra_count)
    {
        const uint16_t first_heavy_row = _defer_count + _dense_count;

        new_pivot_i = 0;

        // For each pivot in the list:
        for (unsigned pivot_i = _next_pivot; pivot_i < _pivot_count; ++pivot_i)
        {
            const uint16_t ge_row_k = _pivots[pivot_i];

            // If unused row is extra:
            if (ge_row_k >= first_heavy_row &&
                ge_row_k < (first_heavy_row + _extra_count))
            {
                // Re-use it
                new_pivot_i = (uint16_t)pivot_i;
                break;
            }
        }

        // If nothing was found, return error
        if (!new_pivot_i) {
            return Wirehair_ExtraInsufficient;
        }

        // Look up row indices
        ge_row_i = _pivots[new_pivot_i];
        row_i = _ge_row_map[ge_row_i];
    }
    else
    {
        // Add extra rows to the end of the pivot list
        new_pivot_i = _pivot_count++;
        row_i = _row_count++;
        ge_row_i = _defer_count + _dense_count + row_i - _block_count;
        _ge_row_map[ge_row_i] = (uint16_t)row_i;
        _pivots[new_pivot_i] = (uint16_t)ge_row_i;

        /*
            Before the extra rows are converted to heavy, the new rows
            are added to the end of the pivot list.  And after the extra
            rows are converted to heavy rows, new rows that come in are
            also heavy and should also be at the end of the pivot list.

            So, this doesn't need to change based on what stage of the
            GE solver is running through at this point.
        */
    }

    CAT_IF_DUMP(cout << "Resuming using row slot " << row_i << " and GE row " << ge_row_i << endl;)

    // Update row data needed at this point
    PeelRow * GF256_RESTRICT row = &_peel_rows[row_i];
    row->RecoveryId = id;

    uint8_t * GF256_RESTRICT block_store_dest = _input_blocks + _block_bytes * row_i;

    // Copy new block to input blocks
    if (id != (unsigned)_block_count - 1) {
        memcpy(block_store_dest, data, _block_bytes);
    }
    else
    {
        memcpy(block_store_dest, data, _output_final_bytes);

        memset(
            block_store_dest + _output_final_bytes,
            0,
            _block_bytes - _output_final_bytes);
    }

    // Generate new GE row
    uint64_t * GF256_RESTRICT ge_new_row = _ge_matrix + _ge_pitch * ge_row_i;

    // Clear the row initially before flipping bits on
    memset(ge_new_row, 0, _ge_pitch * sizeof(uint64_t));

    row->Params.Initialize(
        id,
        _p_seed,
        _block_count,
        _mix_count);

    PeelRowIterator iter(row->Params, _block_count, _block_next_prime);
    const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

    // Generate mixing bits in GE row
    uint16_t ge_column_i = mix.Columns[0] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
    ge_column_i = mix.Columns[1] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
    ge_column_i = mix.Columns[2] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);

    // Generate peeled bits in GE row
    do
    {
        const uint16_t column = iter.GetColumn();

        PeelColumn * GF256_RESTRICT ref_col = &_peel_cols[column];

        // If column is peeled:
        if (ref_col->Mark == MARK_PEEL)
        {
            const unsigned row_k = ref_col->PeelRow;
            const uint64_t * GF256_RESTRICT ge_src_row = _compress_matrix + _ge_pitch * row_k;

            // Add compress row to the new GE row
            for (unsigned ii = 0; ii < _ge_pitch; ++ii) {
                ge_new_row[ii] ^= ge_src_row[ii];
            }
        }
        else
        {
            const unsigned ge_column_k = ref_col->GEColumn;

            // Set bit for this deferred column
            ge_new_row[ge_column_k >> 6] ^= (uint64_t)1 << (ge_column_k & 63);
        }
    } while (iter.Iterate());

    uint64_t ge_mask = 1;

    // For each pivot-found column up to the start of the heavy columns:
    for (uint16_t pivot_j = 0; pivot_j < _next_pivot && pivot_j < _first_heavy_column; ++pivot_j)
    {
        const unsigned word_offset = pivot_j >> 6;
        uint64_t * GF256_RESTRICT rem_row = &ge_new_row[word_offset];

        // If bit is set:
        if (0 != (*rem_row & ge_mask))
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            const uint64_t * GF256_RESTRICT ge_pivot_row = _ge_matrix + word_offset + _ge_pitch * ge_row_j;
            const uint64_t row0 = (*ge_pivot_row & ~(ge_mask - 1)) ^ ge_mask;

            // Unroll first word
            *rem_row ^= row0;

            // Add previous pivot row to new row
            CAT_DEBUG_ASSERT(_ge_pitch >= word_offset);
            for (unsigned ii = 1; ii < _ge_pitch - word_offset; ++ii) {
                rem_row[ii] ^= ge_pivot_row[ii];
            }
        }

        ge_mask = CAT_ROL64(ge_mask, 1);
    }

    // If next pivot is not heavy:
    if (_next_pivot < _first_heavy_column)
    {
        const uint64_t bit = ge_new_row[_next_pivot >> 6] & ((uint64_t)1 << (_next_pivot & 63));

        // If the next pivot was not found on this row:
        if (0 == bit) {
            return Wirehair_NeedMore; // Maybe next time...
        }

        // Swap out the pivot index for this one
        _pivots[new_pivot_i] = _pivots[_next_pivot];
        _pivots[_next_pivot] = (uint16_t)ge_row_i;
    }
    else
    {
        const uint16_t column_count = _defer_count + _mix_count;
        const uint16_t first_heavy_row = _dense_count + _defer_count;
        CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
        const unsigned heavy_row_i = ge_row_i - first_heavy_row;
        CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);
        uint8_t * GF256_RESTRICT heavy_row = _heavy_matrix + _heavy_pitch * heavy_row_i;

        // For each heavy column:
        for (unsigned ge_column_j = _first_heavy_column; ge_column_j < column_count; ++ge_column_j)
        {
            CAT_DEBUG_ASSERT(ge_column_j >= _first_heavy_column);
            const unsigned heavy_col_j = ge_column_j - _first_heavy_column;
            const uint8_t bit_j = static_cast<uint8_t>((ge_new_row[ge_column_j >> 6] >> (ge_column_j & 63)) & 1);

            // Copy bit into column byte
            heavy_row[heavy_col_j] = bit_j;
        }

        // For each pivot-found column in the heavy columns:
        for (unsigned pivot_j = _first_heavy_column; pivot_j < _next_pivot; ++pivot_j)
        {
            CAT_DEBUG_ASSERT(pivot_j >= _first_heavy_column);
            const unsigned heavy_col_j = pivot_j - _first_heavy_column;
            CAT_DEBUG_ASSERT(heavy_col_j < _heavy_columns);
            const uint8_t code_value = heavy_row[heavy_col_j];

            // If column is zero:
            if (0 == code_value) {
                continue; // Skip it
            }

            const unsigned ge_row_j = _pivots[pivot_j];

            // If previous row is heavy:
            if (ge_row_j >= first_heavy_row)
            {
                // Calculate coefficient of elimination
                CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
                const unsigned heavy_row_j = ge_row_j - first_heavy_row;
                CAT_DEBUG_ASSERT(heavy_row_j < _heavy_rows);
                const uint8_t * GF256_RESTRICT heavy_pivot_row = _heavy_matrix + _heavy_pitch * heavy_row_j;
                CAT_DEBUG_ASSERT(heavy_col_j < _heavy_columns);
                const uint8_t pivot_code = heavy_pivot_row[heavy_col_j];
                const unsigned start_column = heavy_col_j + 1;

                // heavy[m+] += exist[m+] * (code_value / pivot_code)
                if (pivot_code == 1) {
                    // heavy[m+] += exist[m+] * code_value
                    gf256_muladd_mem(
                        heavy_row + start_column,
                        code_value,
                        heavy_pivot_row + start_column,
                        _heavy_columns - start_column);
                }
                else
                {
                    // eliminator = code_value / pivot_code
                    const uint8_t eliminator = gf256_div(code_value, pivot_code);

                    // Store eliminator for later
                    heavy_row[heavy_col_j] = eliminator;

                    // heavy[m+] += exist[m+] * eliminator
                    gf256_muladd_mem(
                        heavy_row + start_column,
                        eliminator,
                        heavy_pivot_row + start_column,
                        _heavy_columns - start_column);
                }
            }
            else
            {
                const uint64_t * GF256_RESTRICT other_row = _ge_matrix + _ge_pitch * ge_row_j;

                unsigned ge_column_k = pivot_j + 1;
                uint64_t ge_mask_k = (uint64_t)1 << (ge_column_k & 63);

                // For each remaining column:
                for (; ge_column_k < column_count; ++ge_column_k)
                {
                    const uint64_t word = other_row[ge_column_k >> 6];
                    const bool nonzero = 0 != (word & ge_mask_k);

                    // If bit is nonzero:
                    if (nonzero) {
                        // Add in the code value for this column
                        heavy_row[ge_column_k - _first_heavy_column] ^= code_value;
                    }

                    ge_mask_k = CAT_ROL64(ge_mask_k, 1);
                }
            } // end if row is heavy
        } // next column

        CAT_DEBUG_ASSERT(_next_pivot >= _first_heavy_column);
        const unsigned next_heavy_col = _next_pivot - _first_heavy_column;

        // If the next pivot was not found on this heavy row:
        if (!heavy_row[next_heavy_col]) {
            return Wirehair_NeedMore; // Maybe next time...
        }

        // If a non-heavy pivot just got moved into heavy pivot list:
        if (_next_pivot < _first_heavy_pivot)
        {
            // Swap out the pivot index for this one
            _pivots[new_pivot_i] = _pivots[_first_heavy_pivot];
            _pivots[_first_heavy_pivot] = _pivots[_next_pivot];

            // And move the first heavy pivot up one to cover the hole
            ++_first_heavy_pivot;
        }
        else {
            // Swap out the pivot index for this one
            _pivots[new_pivot_i] = _pivots[_next_pivot];
        }

        CAT_DEBUG_ASSERT(ge_row_i < _pivot_count);
        _pivots[_next_pivot] = (uint16_t)ge_row_i;
    }

    // NOTE: Pivot was found and is definitely not set anywhere else
    // so it doesn't need to be cleared from any other GE rows.

    // If just starting heavy columns:
    if (++_next_pivot == _first_heavy_column) {
        InsertHeavyRows();
    }

    // Resume Triangle() at next pivot to determine
    return Triangle() ? Wirehair_Success : Wirehair_NeedMore;
}